

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

FSerializer *
Serialize<FStrifeDialogueNode>
          (FSerializer *arc,char *key,FStrifeDialogueNode **node,FStrifeDialogueNode **def)

{
  ushort uVar1;
  uint uVar2;
  FWriter *pFVar3;
  Value *pVVar4;
  
  pFVar3 = arc->w;
  if (pFVar3 == (FWriter *)0x0) {
    pVVar4 = FReader::FindKey(arc->r,key);
    if (pVVar4 != (Value *)0x0) {
      uVar1 = (pVVar4->data_).f.flags;
      if ((uVar1 & 0x40) == 0) {
        if (uVar1 != 0) {
          __assert_fail("val->IsUint() || val->IsNull()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                        ,0x7dc,
                        "FSerializer &Serialize(FSerializer &, const char *, FStrifeDialogueNode *&, FStrifeDialogueNode **)"
                       );
        }
      }
      else {
        uVar2 = (pVVar4->data_).s.length;
        if (uVar2 < StrifeDialogues.Count) {
          *node = StrifeDialogues.Array[uVar2];
          return arc;
        }
      }
      *node = (FStrifeDialogueNode *)0x0;
    }
  }
  else {
    uVar2 = (pFVar3->mInObject).Count;
    if ((((uVar2 == 0) || (def == (FStrifeDialogueNode **)0x0)) ||
        ((pFVar3->mInObject).Array[uVar2 - 1] == false)) || (*node != *def)) {
      FSerializer::WriteKey(arc,key);
      if (*node == (FStrifeDialogueNode *)0x0) {
        FWriter::Null(arc->w);
      }
      else {
        FWriter::Uint(arc->w,(*node)->ThisNodeNum);
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FStrifeDialogueNode *&node, FStrifeDialogueNode **def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || node != *def)
		{
			arc.WriteKey(key);
			if (node == nullptr)
			{
				arc.w->Null();
			}
			else
			{
				arc.w->Uint(node->ThisNodeNum);
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsUint() || val->IsNull());
			if (val->IsNull())
			{
				node = nullptr;
			}
			else if (val->IsUint())
			{
				if (val->GetUint() >= StrifeDialogues.Size())
				{
					node = nullptr;
				}
				else
				{
					node = StrifeDialogues[val->GetUint()];
				}
			}
			else
			{
				Printf(TEXTCOLOR_RED "integer expected for '%s'", key);
				arc.mErrors++;
				node = nullptr;
			}
		}
	}
	return arc;

}